

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O1

void TTD::NSSnapValues::ParseTopLevelCommonBodyResolveInfo
               (TopLevelCommonBodyResolveInfo *fbInfo,bool readSeparator,bool parseInline,
               ThreadContext *threadContext,FileReader *reader,SlabAllocator *alloc)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  TTD_LOG_PTR_ID TVar4;
  uint64 uVar5;
  uchar *puVar6;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  
  (*reader->_vptr_FileReader[6])(reader,CONCAT71(in_register_00000031,readSeparator));
  uVar2 = FileReader::ReadUInt32(reader,functionBodyId,false);
  fbInfo->TopLevelBodyCtr = uVar2;
  TVar4 = FileReader::ReadLogTag(reader,ctxTag,true);
  fbInfo->ScriptContextLogId = TVar4;
  (*reader->_vptr_FileReader[3])(reader,0x37,1);
  (*reader->_vptr_FileReader[0x13])(reader,alloc,&fbInfo->FunctionName,0);
  uVar5 = FileReader::ReadUInt64(reader,moduleId,true);
  fbInfo->ModuleId = (ModuleID)uVar5;
  uVar5 = FileReader::ReadUInt64(reader,sourceContextId,true);
  fbInfo->SourceContextId = uVar5;
  (*reader->_vptr_FileReader[3])(reader,0x3f,1);
  (*reader->_vptr_FileReader[0x13])(reader,alloc,&fbInfo->SourceUri,0);
  iVar3 = (*reader->_vptr_FileReader[10])(reader,10,1);
  fbInfo->IsUtf8 = SUB41(iVar3,0);
  uVar2 = FileReader::ReadLengthValue(reader,true);
  fbInfo->ByteLength = uVar2;
  puVar6 = SlabAllocatorBase<0>::SlabAllocateArray<unsigned_char>(alloc,(ulong)uVar2);
  fbInfo->SourceBuffer = puVar6;
  (*reader->_vptr_FileReader[3])(reader,0x43,1);
  ParseSnapFunctionBodyScopeChain(&fbInfo->ScopeChainInfo,reader,alloc);
  if ((int)CONCAT71(in_register_00000011,parseInline) == 0) {
    bVar1 = IsNullPtrTTString(&fbInfo->SourceUri);
    if (!bVar1) {
      JsSupport::ReadCodeFromFile
                (threadContext,false,fbInfo->TopLevelBodyCtr,fbInfo->IsUtf8,fbInfo->SourceBuffer,
                 fbInfo->ByteLength);
      goto LAB_0093d40a;
    }
  }
  if (fbInfo->IsUtf8 == true) {
    TTDAbort_unrecoverable_error("Should only emit char16 encoded data in inline mode.");
  }
  (*reader->_vptr_FileReader[0x17])(reader,fbInfo->SourceBuffer,(ulong)(fbInfo->ByteLength >> 1),1);
LAB_0093d40a:
  fbInfo->DbgSerializedBytecodeSize = 0;
  fbInfo->DbgSerializedBytecodeBuffer = (byte *)0x0;
  return;
}

Assistant:

void ParseTopLevelCommonBodyResolveInfo(TopLevelCommonBodyResolveInfo* fbInfo, bool readSeparator, bool parseInline, ThreadContext* threadContext, FileReader* reader, SlabAllocator& alloc)
        {
            reader->ReadRecordStart(readSeparator);
            fbInfo->TopLevelBodyCtr = reader->ReadUInt32(NSTokens::Key::functionBodyId);
            fbInfo->ScriptContextLogId = reader->ReadLogTag(NSTokens::Key::ctxTag, true);

            reader->ReadString(NSTokens::Key::name, alloc, fbInfo->FunctionName, true);

            fbInfo->ModuleId = (Js::ModuleID)reader->ReadUInt64(NSTokens::Key::moduleId, true);
            fbInfo->SourceContextId = reader->ReadUInt64(NSTokens::Key::sourceContextId, true);
            reader->ReadString(NSTokens::Key::uri, alloc, fbInfo->SourceUri, true);

            fbInfo->IsUtf8 = reader->ReadBool(NSTokens::Key::boolVal, true);
            fbInfo->ByteLength = reader->ReadLengthValue(true);
            fbInfo->SourceBuffer = alloc.SlabAllocateArray<byte>(fbInfo->ByteLength);

            reader->ReadKey(NSTokens::Key::scopeChain, true);
            ParseSnapFunctionBodyScopeChain(fbInfo->ScopeChainInfo, reader, alloc);

            if(parseInline || IsNullPtrTTString(fbInfo->SourceUri))
            {
                TTDAssert(!fbInfo->IsUtf8, "Should only emit char16 encoded data in inline mode.");

                reader->ReadInlineCode((char16*)fbInfo->SourceBuffer, fbInfo->ByteLength / sizeof(char16), true);
            }
            else
            {
                JsSupport::ReadCodeFromFile(threadContext, false, fbInfo->TopLevelBodyCtr, fbInfo->IsUtf8, fbInfo->SourceBuffer, fbInfo->ByteLength);
            }

            fbInfo->DbgSerializedBytecodeSize = 0;
            fbInfo->DbgSerializedBytecodeBuffer = nullptr;
        }